

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O1

double filter_mitchell(double x)

{
  double dVar1;
  
  if (x < -2.0) {
    return 0.0;
  }
  if (-1.0 <= x) {
    if (0.0 <= x) {
      if (1.0 <= x) {
        if (2.0 <= x) {
          return 0.0;
        }
        return ((x * -0.3888888657093048 + 2.0) * x + -3.3333332538604736) * x + 1.7777777910232544;
      }
      dVar1 = x * 1.1666666269302368;
    }
    else {
      dVar1 = x * -1.1666666269302368;
    }
    return (dVar1 + -2.0) * x * x + 0.8888888955116272;
  }
  return 1.7777777910232544 - (-3.3333332538604736 - (x * 0.3888888657093048 + 2.0) * x) * x;
}

Assistant:

static double filter_mitchell(const double x)
{
#define KM_B (1.0f/3.0f)
#define KM_C (1.0f/3.0f)
#define KM_P0 ((  6.0f - 2.0f * KM_B ) / 6.0f)
#define KM_P2 ((-18.0f + 12.0f * KM_B + 6.0f * KM_C) / 6.0f)
#define KM_P3 (( 12.0f - 9.0f  * KM_B - 6.0f * KM_C) / 6.0f)
#define KM_Q0 ((  8.0f * KM_B + 24.0f * KM_C) / 6.0f)
#define KM_Q1 ((-12.0f * KM_B - 48.0f * KM_C) / 6.0f)
#define KM_Q2 ((  6.0f * KM_B + 30.0f * KM_C) / 6.0f)
#define KM_Q3 (( -1.0f * KM_B -  6.0f * KM_C) / 6.0f)

	if (x < -2.0)
		return(0.0f);
	if (x < -1.0)
		return(KM_Q0-x*(KM_Q1-x*(KM_Q2-x*KM_Q3)));
	if (x < 0.0f)
		return(KM_P0+x*x*(KM_P2-x*KM_P3));
	if (x < 1.0f)
		return(KM_P0+x*x*(KM_P2+x*KM_P3));
	if (x < 2.0f)
		return(KM_Q0+x*(KM_Q1+x*(KM_Q2+x*KM_Q3)));
	return(0.0f);
}